

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<wasm::analysis::Flat<unsigned_int>::Element,std::allocator<wasm::analysis::Flat<unsigned_int>::Element>>,void>
               (vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                *container,ostream *os)

{
  pointer pEVar1;
  bool bVar2;
  long lVar3;
  Element *elem;
  pointer obj_bytes;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  obj_bytes = (container->
              super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (container->
           super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (obj_bytes != pEVar1) {
    lVar3 = 0;
    do {
      if (lVar3 == 0) {
LAB_001a94c7:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
        PrintBytesInObjectTo((uchar *)obj_bytes,8,os);
        lVar3 = lVar3 + 1;
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
        if (lVar3 != 0x20) goto LAB_001a94c7;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar2 = true;
      }
    } while ((!bVar2) && (obj_bytes = obj_bytes + 1, obj_bytes != pEVar1));
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }